

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTDMT_expandJobsTable(ZSTDMT_CCtx *mtctx,U32 nbWorkers)

{
  ZSTDMT_jobDescription *pZVar1;
  U32 nbJobs_00;
  U32 nbJobs;
  
  nbJobs = nbWorkers + 2;
  nbJobs_00 = mtctx->jobIDMask + 1;
  if (nbJobs_00 < nbJobs) {
    ZSTDMT_freeJobsTable(mtctx->jobs,nbJobs_00,mtctx->cMem);
    mtctx->jobIDMask = 0;
    pZVar1 = ZSTDMT_createJobsTable(&nbJobs,mtctx->cMem);
    mtctx->jobs = pZVar1;
    if (pZVar1 == (ZSTDMT_jobDescription *)0x0) {
      return 0xffffffffffffffc0;
    }
    if (POPCOUNT(nbJobs) != 1) {
      __assert_fail("(nbJobs != 0) && ((nbJobs & (nbJobs - 1)) == 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x4dc0,"size_t ZSTDMT_expandJobsTable(ZSTDMT_CCtx *, U32)");
    }
    mtctx->jobIDMask = nbJobs - 1;
  }
  return 0;
}

Assistant:

static size_t ZSTDMT_expandJobsTable (ZSTDMT_CCtx* mtctx, U32 nbWorkers) {
    U32 nbJobs = nbWorkers + 2;
    if (nbJobs > mtctx->jobIDMask+1) {  /* need more job capacity */
        ZSTDMT_freeJobsTable(mtctx->jobs, mtctx->jobIDMask+1, mtctx->cMem);
        mtctx->jobIDMask = 0;
        mtctx->jobs = ZSTDMT_createJobsTable(&nbJobs, mtctx->cMem);
        if (mtctx->jobs==NULL) return ERROR(memory_allocation);
        assert((nbJobs != 0) && ((nbJobs & (nbJobs - 1)) == 0));  /* ensure nbJobs is a power of 2 */
        mtctx->jobIDMask = nbJobs - 1;
    }
    return 0;
}